

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

Status cmsys::SystemTools::MakeDirectory(string *path,mode_t *mode)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  Status SVar4;
  undefined1 *puVar5;
  int *piVar6;
  undefined1 local_78 [8];
  string topdir;
  size_type pos;
  undefined1 local_40 [8];
  string dir;
  mode_t *mode_local;
  string *path_local;
  
  dir.field_2._8_8_ = mode;
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    SVar4 = Status::POSIX(0x16);
    return SVar4;
  }
  bVar1 = PathExists(path);
  if (!bVar1) {
    std::__cxx11::string::string((string *)local_40,(string *)path);
    ConvertToUnixSlashes((string *)local_40);
    topdir.field_2._8_8_ = 0;
    std::__cxx11::string::string((string *)local_78);
    while (topdir.field_2._8_8_ = std::__cxx11::string::find((char)local_40,0x2f),
          topdir.field_2._8_8_ != -1) {
      puVar5 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_40);
      *puVar5 = 0;
      Mkdir((string *)local_40,(mode_t *)dir.field_2._8_8_);
      puVar5 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_40);
      *puVar5 = 0x2f;
      topdir.field_2._8_8_ = topdir.field_2._8_8_ + 1;
    }
    std::__cxx11::string::operator=((string *)local_78,(string *)local_40);
    iVar2 = Mkdir((string *)local_78,(mode_t *)dir.field_2._8_8_);
    if ((iVar2 == 0) || (piVar6 = __errno_location(), *piVar6 == 0x11)) {
      path_local = (string *)Status::Success();
    }
    else {
      path_local = (string *)Status::POSIX_errno();
    }
    std::__cxx11::string::~string((string *)local_78);
    std::__cxx11::string::~string((string *)local_40);
    return (Status)path_local;
  }
  bVar1 = FileIsDirectory(path);
  if (!bVar1) {
    SVar4 = Status::POSIX(0x11);
    return SVar4;
  }
  SVar4 = Status::Success();
  return SVar4;
}

Assistant:

Status SystemTools::MakeDirectory(std::string const& path, const mode_t* mode)
{
  if (path.empty()) {
    return Status::POSIX(EINVAL);
  }
  if (SystemTools::PathExists(path)) {
    if (SystemTools::FileIsDirectory(path)) {
      return Status::Success();
    }
    return Status::POSIX(EEXIST);
  }
  std::string dir = path;
  SystemTools::ConvertToUnixSlashes(dir);

  std::string::size_type pos = 0;
  std::string topdir;
  while ((pos = dir.find('/', pos)) != std::string::npos) {
    // all underlying functions use C strings, so temporarily
    // end the string here
    dir[pos] = '\0';

    Mkdir(dir, mode);
    dir[pos] = '/';

    ++pos;
  }
  topdir = dir;
  if (Mkdir(topdir, mode) != 0 && errno != EEXIST) {
    return Status::POSIX_errno();
  }

  return Status::Success();
}